

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O0

bool __thiscall Movie::Verify(Movie *this,Verifier *verifier)

{
  bool bVar1;
  Character type;
  void *obj;
  Vector<unsigned_char,_unsigned_int> *pVVar2;
  Vector<flatbuffers::Offset<void>,_unsigned_int> *pVVar3;
  undefined1 local_19;
  Verifier *verifier_local;
  Movie *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyField<unsigned_char>(&this->super_Table,verifier,4,1);
    local_19 = false;
    if (bVar1) {
      bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6);
      local_19 = false;
      if (bVar1) {
        obj = main_character(this);
        type = main_character_type(this);
        bVar1 = VerifyCharacter(verifier,obj,type);
        local_19 = false;
        if (bVar1) {
          bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8);
          local_19 = false;
          if (bVar1) {
            pVVar2 = characters_type(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_int>
                              (verifier,pVVar2);
            local_19 = false;
            if (bVar1) {
              bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10)
              ;
              local_19 = false;
              if (bVar1) {
                pVVar3 = characters(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::
                        VerifyVector<flatbuffers::Offset<void>,_unsigned_int>(verifier,pVVar3);
                local_19 = false;
                if (bVar1) {
                  pVVar3 = characters(this);
                  pVVar2 = characters_type(this);
                  bVar1 = VerifyCharacterVector(verifier,pVVar3,pVVar2);
                  local_19 = false;
                  if (bVar1) {
                    local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<uint8_t>(verifier, VT_MAIN_CHARACTER_TYPE, 1) &&
           VerifyOffset(verifier, VT_MAIN_CHARACTER) &&
           VerifyCharacter(verifier, main_character(), main_character_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS_TYPE) &&
           verifier.VerifyVector(characters_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS) &&
           verifier.VerifyVector(characters()) &&
           VerifyCharacterVector(verifier, characters(), characters_type()) &&
           verifier.EndTable();
  }